

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_text::as_bool(xml_text *this,bool def)

{
  xml_node_struct *pxVar1;
  byte local_31;
  char_t *value;
  xml_node_struct *d;
  bool def_local;
  xml_text *this_local;
  
  pxVar1 = _data(this);
  this_local._7_1_ = def;
  if (pxVar1 != (xml_node_struct *)0x0) {
    local_31 = def;
    if (pxVar1->value != (char_t *)0x0) {
      local_31 = impl::anon_unknown_0::get_value_bool(pxVar1->value);
    }
    this_local._7_1_ = local_31 & 1;
  }
  return (bool)this_local._7_1_;
}

Assistant:

PUGI__FN bool xml_text::as_bool(bool def) const
	{
		xml_node_struct* d = _data();
		if (!d) return def;
		const char_t* value = d->value;
		return value ? impl::get_value_bool(value) : def;
	}